

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadSketch.h
# Opt level: O3

void __thiscall
SpreadSketchWrapper<4U>::SpreadSketchWrapper(SpreadSketchWrapper<4U> *this,int memory,int _HIT)

{
  DetectorSS *this_00;
  
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111d30;
  (this->super_Abstract<4U>).HIT = _HIT;
  this_00 = (DetectorSS *)operator_new(0x70);
  DetectorSS::DetectorSS(this_00,4,memory / 0xef,0x20,0x4f,3,0x1b6);
  this->sketch = this_00;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).name,0,
             (char *)(this->super_Abstract<4U>).name._M_string_length,0x10c876);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).sep,0,
             (char *)(this->super_Abstract<4U>).sep._M_string_length,0x10c865);
  return;
}

Assistant:

SpreadSketchWrapper(int memory, int _HIT) {
		this->HIT = _HIT;
		// total_mem = cmdepth*cmwidth*(memory+lgn+8)/8
		int width = memory * 8 / 4 / (438 + 32 + 8);
		sketch = new DetectorSS(4, width, 32, 79, 3, 438);
		this->name = "SpreadSketch";
		this->sep = "\t";
	}